

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O0

void __thiscall
pbrt::InternCache<pbrt::Transform,_std::hash<pbrt::Transform>_>::Insert
          (InternCache<pbrt::Transform,_std::hash<pbrt::Transform>_> *this,Transform *ptr,
          vector<const_pbrt::Transform_*,_pstd::pmr::polymorphic_allocator<const_pbrt::Transform_*>_>
          *table)

{
  size_t sVar1;
  size_t sVar2;
  reference ppTVar3;
  long lVar4;
  vector<const_pbrt::Transform_*,_pstd::pmr::polymorphic_allocator<const_pbrt::Transform_*>_>
  *in_RDX;
  value_type in_RSI;
  int step;
  size_t offset;
  Transform *in_stack_00000088;
  hash<pbrt::Transform> *in_stack_00000090;
  undefined4 local_28;
  undefined8 local_20;
  
  sVar1 = std::hash<pbrt::Transform>::operator()(in_stack_00000090,in_stack_00000088);
  sVar2 = pstd::
          vector<const_pbrt::Transform_*,_pstd::pmr::polymorphic_allocator<const_pbrt::Transform_*>_>
          ::size(in_RDX);
  local_20 = sVar1 % sVar2;
  local_28 = 1;
  while( true ) {
    ppTVar3 = pstd::
              vector<const_pbrt::Transform_*,_pstd::pmr::polymorphic_allocator<const_pbrt::Transform_*>_>
              ::operator[](in_RDX,local_20);
    if (*ppTVar3 == (value_type)0x0) break;
    lVar4 = (long)local_28;
    local_28 = local_28 + 1;
    sVar1 = pstd::
            vector<const_pbrt::Transform_*,_pstd::pmr::polymorphic_allocator<const_pbrt::Transform_*>_>
            ::size(in_RDX);
    local_20 = (lVar4 + local_20) % sVar1;
  }
  ppTVar3 = pstd::
            vector<const_pbrt::Transform_*,_pstd::pmr::polymorphic_allocator<const_pbrt::Transform_*>_>
            ::operator[](in_RDX,local_20);
  *ppTVar3 = in_RSI;
  return;
}

Assistant:

void Insert(const T *ptr, pstd::vector<const T *> *table) {
        size_t offset = Hash()(*ptr) % table->size();
        int step = 1;
        // Advance _offset_ to next free entry in hash table
        while ((*table)[offset]) {
            offset += step;
            ++step;
            offset %= table->size();
        }

        (*table)[offset] = ptr;
    }